

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittests.cc
# Opt level: O0

void __thiscall
anon_unknown.dwarf_30c12::createDFDCompressedTest1_FormatETC2_SR8B8G8_Test::TestBody
          (createDFDCompressedTest1_FormatETC2_SR8B8G8_Test *this)

{
  bool bVar1;
  void *__ptr;
  char *pcVar2;
  long in_RDI;
  AssertionResult gtest_ar_1;
  AssertionResult gtest_ar;
  uint32_t *dfd;
  AssertHelper *this_00;
  uint *lhs;
  char *in_stack_ffffffffffffff50;
  char *in_stack_ffffffffffffff58;
  char *in_stack_ffffffffffffff60;
  Type type;
  AssertHelper *in_stack_ffffffffffffff70;
  ktx_uint32_t in_stack_ffffffffffffff78;
  ktx_uint8_t in_stack_ffffffffffffff7c;
  ktx_uint8_t in_stack_ffffffffffffff7d;
  ktx_uint8_t in_stack_ffffffffffffff7e;
  ktx_uint8_t in_stack_ffffffffffffff7f;
  undefined4 in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff84;
  ktx_uint32_t in_stack_ffffffffffffff90;
  initializer_list<(anonymous_namespace)::createDFDTestBase<1U,_8U>::sampleType>
  in_stack_ffffffffffffff98;
  Message *message;
  AssertHelper *in_stack_ffffffffffffffc0;
  AssertHelper local_28;
  undefined4 local_20;
  undefined4 local_1c;
  AssertHelper *local_18;
  undefined8 local_10;
  
  local_28.data_ = (AssertHelperData *)0x23f0000;
  local_20 = 0;
  local_1c = 0xffffffff;
  this_00 = &local_28;
  local_10 = 1;
  lhs = (uint *)0x1;
  local_18 = this_00;
  createDFDTestBaseComp<1U,_8U>::customize
            ((createDFDTestBaseComp<1U,_8U> *)
             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),in_stack_ffffffffffffff7f
             ,in_stack_ffffffffffffff7e,in_stack_ffffffffffffff7d,in_stack_ffffffffffffff7c,
             in_stack_ffffffffffffff78,in_stack_ffffffffffffff90,in_stack_ffffffffffffff98);
  __ptr = (void *)createDFDCompressed(8,4,4,1);
  message = (Message *)0x2c;
  testing::internal::EqHelper::Compare<unsigned_int,_unsigned_long,_nullptr>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,lhs,(unsigned_long *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffffc0);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    in_stack_ffffffffffffff60 =
         testing::AssertionResult::failure_message((AssertionResult *)0x148933);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,(Type)((ulong)in_RDI >> 0x20),in_stack_ffffffffffffff60,
               (int)((ulong)in_stack_ffffffffffffff58 >> 0x20),in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x148981);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1489d7);
  memcmp((void *)(in_RDI + 0x10),(void *)((long)__ptr + 4),0x28);
  type = (Type)((ulong)in_RDI >> 0x20);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            (in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,(int *)lhs,(int *)this_00);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff88);
  if (!bVar1) {
    testing::Message::Message((Message *)in_stack_ffffffffffffff70);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)0x148a61);
    testing::internal::AssertHelper::AssertHelper
              (in_stack_ffffffffffffff70,type,in_stack_ffffffffffffff60,(int)((ulong)pcVar2 >> 0x20)
               ,in_stack_ffffffffffffff50);
    testing::internal::AssertHelper::operator=(in_stack_ffffffffffffffc0,message);
    testing::internal::AssertHelper::~AssertHelper(this_00);
    testing::Message::~Message((Message *)0x148aaf);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x148aff);
  free(__ptr);
  return;
}

Assistant:

TEST_F(createDFDCompressedTest1, FormatETC2_SR8B8G8) {
    customize(KHR_DF_MODEL_ETC2, KHR_DF_PRIMARIES_BT709,
              KHR_DF_TRANSFER_SRGB, KHR_DF_FLAG_ALPHA_STRAIGHT,
              3, 3,
              {
                {0, 63, KHR_DF_CHANNEL_ETC2_COLOR, 0, 0, 0, 0, 0, 0xFFFFFFFF},
              }
             );

    uint32_t* dfd = createDFDCompressed(c_ETC2_R8G8B8, 4, 4, 1, s_SRGB);

    EXPECT_EQ(*dfd, sizeof(expected) + 4U);
    EXPECT_EQ(memcmp(&expected, dfd+1, sizeof(expected)), 0);

    free(dfd);
}